

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

SmartPointer<GEO::ThreadManager> * __thiscall
GEO::SmartPointer<GEO::ThreadManager>::operator=
          (SmartPointer<GEO::ThreadManager> *this,ThreadManager *ptr)

{
  int *piVar1;
  
  if (&this->pointer_->super_Counted != &ptr->super_Counted) {
    Counted::unref(&this->pointer_->super_Counted);
    this->pointer_ = ptr;
    if (ptr != (ThreadManager *)0x0) {
      piVar1 = &(ptr->super_Counted).nb_refs_;
      *piVar1 = *piVar1 + 1;
    }
  }
  return this;
}

Assistant:

SmartPointer<T>& operator= (T* ptr) {
            if(ptr != pointer_) {
                T::unref(pointer_);
                pointer_ = ptr;
                T::ref(pointer_);
            }
            return *this;
        }